

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::SetTrimStartVertex(ON_Brep *this,int ti0,int vi)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ON_BrepTrim *pOVar5;
  ON_BrepEdge *pOVar6;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int edge_trim_count_1;
  ON_BrepTrim *trim_1;
  int tvi1;
  int ti1;
  int edge_trim_count;
  ON_BrepTrim *trim;
  int local_38;
  int edge_count;
  int counter;
  int tvi;
  int evi;
  int ei;
  int ti;
  int next_ti;
  int vi_local;
  int ti0_local;
  ON_Brep *this_local;
  
  if ((ti0 < 0) || (vi < 0)) {
    this_local._7_1_ = false;
  }
  else {
    ti = vi;
    next_ti = ti0;
    _vi_local = this;
    iVar2 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
    evi = next_ti;
    edge_count = 0;
    for (local_38 = 0; -1 < evi && local_38 < 0x200; local_38 = local_38 + 1) {
      if (((0 < local_38) && (evi == next_ti)) && (edge_count == 0)) {
        return true;
      }
      pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
      if (pOVar5->m_type == singular) {
        pOVar5->m_vi[1] = ti;
        pOVar5->m_vi[0] = ti;
        edge_count = 1 - edge_count;
        if (edge_count == 0) {
          local_78 = PrevTrim(this,evi);
        }
        else {
          local_78 = NextTrim(this,evi);
        }
        ei = local_78;
        evi = local_78;
        edge_count = 1 - edge_count;
        if ((local_78 == next_ti) && (edge_count == 0)) {
          return true;
        }
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_78);
        if (pOVar5->m_type != singular) {
          HopAcrossEdge(this,&evi,&edge_count);
        }
      }
      else {
        tvi = pOVar5->m_ei;
        if ((pOVar5->m_bRev3d & 1U) == 0) {
          local_7c = edge_count;
        }
        else {
          local_7c = 1 - edge_count;
        }
        counter = local_7c;
        bVar1 = SetEdgeVertex(this,tvi,local_7c,ti);
        if (!bVar1) {
          return false;
        }
        if (edge_count == 0) {
          local_80 = PrevTrim(this,evi);
        }
        else {
          local_80 = NextTrim(this,evi);
        }
        ei = local_80;
        evi = local_80;
        edge_count = 1 - edge_count;
        if (local_80 < 0) {
          return false;
        }
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_80);
        if (pOVar5->m_type != singular) {
          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
          tvi = pOVar5->m_ei;
          if ((tvi < 0) || (iVar2 <= tvi)) {
            return false;
          }
          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
          if ((pOVar5->m_bRev3d & 1U) == 0) {
            local_84 = edge_count;
          }
          else {
            local_84 = 1 - edge_count;
          }
          counter = local_84;
          pOVar6 = ON_ClassArray<ON_BrepEdge>::operator[]
                             ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,tvi);
          iVar3 = ON_SimpleArray<int>::Count(&pOVar6->m_ti);
          if (iVar3 < 1) break;
          if (iVar3 == 1) {
            SetEdgeVertex(this,tvi,counter,ti);
            break;
          }
          bVar1 = HopAcrossEdge(this,&evi,&edge_count);
          if (!bVar1) {
            return false;
          }
        }
      }
    }
    evi = next_ti;
    edge_count = 0;
    pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                       ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,next_ti);
    if (pOVar5->m_type == singular) {
      do {
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
        iVar2 = ti;
        if (pOVar5->m_type != singular) break;
        if (evi != next_ti) {
          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
          iVar3 = ti;
          pOVar5->m_vi[0] = iVar2;
          pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                             ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
          pOVar5->m_vi[1] = iVar3;
        }
        evi = PrevTrim(this,evi);
        edge_count = 1;
      } while (evi != next_ti);
      pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
      tvi = pOVar5->m_ei;
      if (-1 < tvi) {
        pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
        if ((pOVar5->m_bRev3d & 1U) == 0) {
          local_90 = edge_count;
        }
        else {
          local_90 = 1 - edge_count;
        }
        counter = local_90;
        SetEdgeVertex(this,tvi,local_90,ti);
      }
    }
    else {
      pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
      tvi = pOVar5->m_ei;
    }
    if (tvi < 0) {
      this_local._7_1_ = true;
    }
    else {
      pOVar6 = ON_ClassArray<ON_BrepEdge>::operator[]((ON_ClassArray<ON_BrepEdge> *)&this->m_E,tvi);
      iVar2 = ON_SimpleArray<int>::Count(&pOVar6->m_ti);
      if (iVar2 < 2) {
        this_local._7_1_ = true;
      }
      else {
        bVar1 = HopAcrossEdge(this,&evi,&edge_count);
        if (bVar1) {
          if (edge_count == 0) {
            local_94 = PrevTrim(this,evi);
          }
          else {
            local_94 = NextTrim(this,evi);
          }
          ei = local_94;
          if (local_94 < 0) {
            this_local._7_1_ = false;
          }
          else {
            evi = local_94;
            edge_count = 1 - edge_count;
            pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                               ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_94);
            if (pOVar5->m_type != singular) {
              pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                 ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
              tvi = pOVar5->m_ei;
              if (tvi < 0) {
                return false;
              }
              pOVar6 = ON_ClassArray<ON_BrepEdge>::operator[]
                                 ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,tvi);
              iVar2 = ON_SimpleArray<int>::Count(&pOVar6->m_ti);
              if (iVar2 == 1) {
                pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
                if ((pOVar5->m_bRev3d & 1U) == 0) {
                  local_98 = edge_count;
                }
                else {
                  local_98 = 1 - edge_count;
                }
                counter = local_98;
                SetEdgeVertex(this,tvi,local_98,ti);
                return true;
              }
              bVar1 = HopAcrossEdge(this,&evi,&edge_count);
              if (!bVar1) {
                return false;
              }
            }
            iVar3 = evi;
            iVar2 = edge_count;
            for (local_38 = 0; -1 < evi && local_38 < 0x200; local_38 = local_38 + 1) {
              if (((0 < local_38) && (evi == iVar3)) && (edge_count == iVar2)) {
                return false;
              }
              pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                 ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
              if (pOVar5->m_type == singular) {
                pOVar5->m_vi[1] = ti;
                pOVar5->m_vi[0] = ti;
                edge_count = 1 - edge_count;
                if (edge_count == 0) {
                  local_a0 = PrevTrim(this,evi);
                }
                else {
                  local_a0 = NextTrim(this,evi);
                }
                ei = local_a0;
                evi = local_a0;
                edge_count = 1 - edge_count;
                if ((local_a0 == iVar3) && (edge_count == iVar2)) {
                  return false;
                }
                pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_a0);
                if (pOVar5->m_type != singular) {
                  HopAcrossEdge(this,&evi,&edge_count);
                }
              }
              else {
                tvi = pOVar5->m_ei;
                if ((pOVar5->m_bRev3d & 1U) == 0) {
                  local_a4 = edge_count;
                }
                else {
                  local_a4 = 1 - edge_count;
                }
                counter = local_a4;
                bVar1 = SetEdgeVertex(this,tvi,local_a4,ti);
                if (!bVar1) {
                  return false;
                }
                if (edge_count == 0) {
                  local_a8 = PrevTrim(this,evi);
                }
                else {
                  local_a8 = NextTrim(this,evi);
                }
                ei = local_a8;
                evi = local_a8;
                edge_count = 1 - edge_count;
                if (local_a8 < 0) {
                  return false;
                }
                pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                   ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,local_a8);
                if (pOVar5->m_type != singular) {
                  pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                     ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
                  tvi = pOVar5->m_ei;
                  if (tvi < 0) {
                    return false;
                  }
                  pOVar5 = ON_ClassArray<ON_BrepTrim>::operator[]
                                     ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,evi);
                  if ((pOVar5->m_bRev3d & 1U) == 0) {
                    local_ac = edge_count;
                  }
                  else {
                    local_ac = 1 - edge_count;
                  }
                  counter = local_ac;
                  pOVar6 = ON_ClassArray<ON_BrepEdge>::operator[]
                                     ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,tvi);
                  iVar4 = ON_SimpleArray<int>::Count(&pOVar6->m_ti);
                  if (iVar4 < 1) break;
                  if (iVar4 == 1) {
                    SetEdgeVertex(this,tvi,counter,ti);
                    return true;
                  }
                  bVar1 = HopAcrossEdge(this,&evi,&edge_count);
                  if (!bVar1) {
                    return false;
                  }
                }
              }
            }
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Brep::SetTrimStartVertex( const int ti0, const int vi )
{
  // Do not use NextEdge(), PrevEdge() because they require
  // the information we are in the act of creating.
  if ( ti0 < 0 || vi < 0 )
    return false;
  int next_ti, ti, ei, evi, tvi, counter;

  const int edge_count = m_E.Count();

  // Step counter clockwise around vertex until we hit a boundary
  // or we get back to where we started.
  for ( ti = ti0, tvi = 0, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti0 && tvi == 0 )
        return true; // vertex was interior
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi ); // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen

    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 || ei >= edge_count )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      break; // ran into boundary
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }


  // Get ready to step counter clockwise around vertex until
  // we hit a boundary.
  ti = ti0;
  tvi = 0;
  if ( m_T[ti].m_type == ON_BrepTrim::singular ) {
    // back up until we get to a non-singular trim
    while ( m_T[ti].m_type == ON_BrepTrim::singular ) {
      if ( ti != ti0 ) {
        m_T[ti].m_vi[0] = vi;
        m_T[ti].m_vi[1] = vi;
      }
      ti = PrevTrim(ti);
      tvi = 1;
      if ( ti == ti0 )
        break;
    }
    ei = m_T[ti].m_ei;
    if ( ei >= 0 ) {
      evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
    }
  }
  else {
    ei = m_T[ti].m_ei;
  }
  if ( ei < 0 ) {
    // did the best we could - return true so setter keeps going
    // but the fact we are here means the brep is bogus.
    return true;
  }
  if ( m_E[ei].m_ti.Count() < 2 )
    return true; // ti0 is a boundary - we're done.
  if ( !HopAcrossEdge( ti, tvi ) )
    return false;
  next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
  if ( next_ti < 0 )
    return false;
  ti = next_ti;
  tvi = 1-tvi;
  if ( m_T[ti].m_type != ON_BrepTrim::singular ) {
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false;
    if ( m_E[ei].m_ti.Count() == 1 ) {
      evi = (m_T[ti].m_bRev3d)? 1-tvi : tvi;
      SetEdgeVertex( ei, evi, vi );
      return true;
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  const int ti1 = ti;
  const int tvi1 = tvi;
  
  for ( ti = ti1, tvi = tvi1, counter = 0; ti >= 0 && counter < 512; counter++ ) {
    if ( counter > 0 ) {
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
    }
    ON_BrepTrim& trim = m_T[ti];
    if ( trim.m_type == ON_BrepTrim::singular ) {
      trim.m_vi[0] = trim.m_vi[1] = vi;
      tvi = 1-tvi;
      next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
      ti = next_ti;
      tvi = 1-tvi;
      if ( ti == ti1 && tvi == tvi1 )
        return false; // vertex is not interior - so this should not happen
      if ( m_T[ti].m_type != ON_BrepTrim::singular )
        HopAcrossEdge( ti, tvi );  // OK if hop fails because ti is a boundary
      continue;
    }

    ei = trim.m_ei;
    evi = (trim.m_bRev3d) ? 1-tvi : tvi;
    if ( !SetEdgeVertex( ei, evi, vi ) )
      return false;
    next_ti = (tvi) ? NextTrim(ti) : PrevTrim(ti);
    ti = next_ti;
    tvi = 1-tvi;
    if ( ti < 0 )
      return false; // should not happen
    
    if ( m_T[ti].m_type == ON_BrepTrim::singular )
      continue;
    ei = m_T[ti].m_ei;
    if ( ei < 0 )
      return false; // should not happen
    evi = (m_T[ti].m_bRev3d) ? 1-tvi : tvi;
    const int edge_trim_count = m_E[ei].m_ti.Count();
    if ( edge_trim_count < 1 )
      break; // should not happen
    if ( edge_trim_count == 1 ) {
      SetEdgeVertex( ei, evi, vi );
      return true; // ran into boundary - expected
    }
    if ( !HopAcrossEdge( ti, tvi ) )
      return false;
  }

  return false; // should have exited by hitting "expected" boundary ~10 lines above
}